

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

Var Js::JavascriptMap::EntryGet(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  Var aValue;
  JavascriptLibrary *pJVar5;
  RecyclableObject *local_90;
  JavascriptMap *local_88;
  Var local_70;
  Var value;
  Var key;
  JavascriptMap *map;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0xc1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  map = (JavascriptMap *)RecyclableObject::GetScriptContext(function);
  aValue = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptMap>(aValue);
  if (bVar2) {
    local_88 = UnsafeVarTo<Js::JavascriptMap>(aValue);
  }
  else {
    local_88 = (JavascriptMap *)0x0;
  }
  key = local_88;
  if (local_88 == (JavascriptMap *)0x0) {
    JavascriptError::ThrowTypeErrorVar((ScriptContext *)map,-0x7ff5ec04,L"Map.prototype.get",L"Map")
    ;
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar5 = ScriptContext::GetLibrary((ScriptContext *)map);
    local_90 = JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
  }
  else {
    local_90 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  value = local_90;
  local_70 = (Var)0x0;
  bVar2 = Get((JavascriptMap *)key,local_90,&local_70);
  if (bVar2) {
    callInfo_local = (CallInfo)CrossSite::MarshalVar((ScriptContext *)map,local_70,false);
  }
  else {
    pJVar5 = ScriptContext::GetLibrary((ScriptContext *)map);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptMap::EntryGet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.get"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    Var value = nullptr;

    if (map->Get(key, &value))
    {
        return CrossSite::MarshalVar(scriptContext, value);
    }

    return scriptContext->GetLibrary()->GetUndefined();
}